

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::Synchronize(WastParser *this,SynchronizeFunc *func)

{
  TokenTypePair TVar1;
  int iVar2;
  bool bVar3;
  string local_90;
  Token token;
  
  iVar2 = 10;
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      return (Result)Error;
    }
    TVar1 = PeekPair(this);
    bVar3 = (*func)((TokenTypePair)TVar1._M_elems);
    if (bVar3) break;
    Consume(&token,this);
    if (token.token_type_ == Reserved) {
      Token::to_string_clamp_abi_cxx11_(&local_90,&token,0x50);
      Error(this,0x1eeabd,local_90._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
    }
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::Synchronize(SynchronizeFunc func) {
  static const int kMaxConsumed = 10;
  for (int i = 0; i < kMaxConsumed; ++i) {
    if (func(PeekPair())) {
      return Result::Ok;
    }

    Token token = Consume();
    if (token.token_type() == TokenType::Reserved) {
      Error(token.loc, "unexpected token %s.",
            token.to_string_clamp(kMaxErrorTokenLength).c_str());
    }
  }

  return Result::Error;
}